

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BehaviourTree.h
# Opt level: O2

void __thiscall BehaviourTree::DecoratorNode::~DecoratorNode(DecoratorNode *this)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__DecoratorNode_00111600;
  if (this->child != (Node *)0x0) {
    this->child = (Node *)0x0;
  }
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

virtual ~DecoratorNode() {
            if (child != nullptr) {
                //delete child;
                child = nullptr;
            }
        }